

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qmdiarea.cpp
# Opt level: O2

void QMdiArea::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QBrush *brush;
  undefined8 uVar1;
  undefined1 uVar2;
  undefined4 uVar3;
  undefined8 *puVar4;
  long in_FS_OFFSET;
  undefined8 local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        subWindowActivated((QMdiArea *)_o,*_a[1]);
        return;
      }
      break;
    case 1:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setActiveSubWindow((QMdiArea *)_o,*_a[1]);
        return;
      }
      break;
    case 2:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        tileSubWindows((QMdiArea *)_o);
        return;
      }
      break;
    case 3:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        cascadeSubWindows((QMdiArea *)_o);
        return;
      }
      break;
    case 4:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        closeActiveSubWindow((QMdiArea *)_o);
        return;
      }
      break;
    case 5:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        closeAllSubWindows((QMdiArea *)_o);
        return;
      }
      break;
    case 6:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        activateNextSubWindow((QMdiArea *)_o);
        return;
      }
      break;
    case 7:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        activatePreviousSubWindow((QMdiArea *)_o);
        return;
      }
      break;
    case 8:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        (**(code **)(*(long *)_o + 0x1a8))
                  (_o,*_a[1],*(long *)(in_FS_OFFSET + 0x28),*(code **)(*(long *)_o + 0x1a8));
        return;
      }
      break;
    case 9:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QMdiAreaPrivate::_q_deactivateAllWindows(*(QMdiAreaPrivate **)(_o + 8),(QMdiSubWindow *)0x0)
        ;
        return;
      }
      break;
    case 10:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QMdiAreaPrivate::_q_processWindowStateChanged
                  (*(QMdiAreaPrivate **)(_o + 8),
                   (QFlagsStorageHelper<Qt::WindowState,_4>)
                   ((QFlagsStorageHelper<Qt::WindowState,_4> *)_a[1])->
                   super_QFlagsStorage<Qt::WindowState>,
                   (QFlagsStorageHelper<Qt::WindowState,_4>)
                   ((QFlagsStorageHelper<Qt::WindowState,_4> *)_a[2])->
                   super_QFlagsStorage<Qt::WindowState>);
        return;
      }
      break;
    case 0xb:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QMdiAreaPrivate::_q_currentTabChanged(*(QMdiAreaPrivate **)(_o + 8),*_a[1]);
        return;
      }
      break;
    case 0xc:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QMdiAreaPrivate::_q_closeTab(*(QMdiAreaPrivate **)(_o + 8),*_a[1]);
        return;
      }
      break;
    case 0xd:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QMdiAreaPrivate::_q_moveTab(*(QMdiAreaPrivate **)(_o + 8),*_a[1],*_a[2]);
        return;
      }
      break;
    default:
      goto switchD_0040f9f7_caseD_3;
    }
    goto LAB_0040fe97;
  case ReadProperty:
    if (7 < (uint)_id) break;
    puVar4 = (undefined8 *)*_a;
    switch(_id) {
    case 0:
      background((QMdiArea *)&local_20);
      uVar1 = *puVar4;
      *puVar4 = local_20;
      local_20 = uVar1;
      QBrush::~QBrush((QBrush *)&local_20);
      goto switchD_0040f9f7_caseD_3;
    case 1:
      uVar3 = *(undefined4 *)(*(long *)(_o + 8) + 0x3b0);
      break;
    case 2:
      uVar3 = *(undefined4 *)(*(long *)(_o + 8) + 0x3b8);
      break;
    case 3:
      uVar2 = *(undefined1 *)(*(long *)(_o + 8) + 0x3bc);
      goto LAB_0040fc6e;
    case 4:
      uVar2 = *(undefined1 *)(*(long *)(_o + 8) + 0x3bd);
      goto LAB_0040fc6e;
    case 5:
      uVar2 = *(undefined1 *)(*(long *)(_o + 8) + 0x3be);
LAB_0040fc6e:
      *(undefined1 *)puVar4 = uVar2;
      goto switchD_0040f9f7_caseD_3;
    case 6:
      uVar3 = *(undefined4 *)(*(long *)(_o + 8) + 0x3c0);
      break;
    case 7:
      uVar3 = *(undefined4 *)(*(long *)(_o + 8) + 0x3c4);
    }
    *(undefined4 *)puVar4 = uVar3;
    break;
  case WriteProperty:
    if ((uint)_id < 8) {
      brush = (QBrush *)*_a;
      switch(_id) {
      case 0:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setBackground((QMdiArea *)_o,brush);
          return;
        }
        break;
      case 1:
        if (*(int *)(*(long *)(_o + 8) + 0x3b0) != *(int *)brush) {
          *(int *)(*(long *)(_o + 8) + 0x3b0) = *(int *)brush;
        }
        goto switchD_0040f9f7_caseD_3;
      case 2:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setViewMode((QMdiArea *)_o,*(ViewMode *)brush);
          return;
        }
        break;
      case 3:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setDocumentMode((QMdiArea *)_o,(bool)*brush);
          return;
        }
        break;
      case 4:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setTabsClosable((QMdiArea *)_o,(bool)*brush);
          return;
        }
        break;
      case 5:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setTabsMovable((QMdiArea *)_o,(bool)*brush);
          return;
        }
        break;
      case 6:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setTabShape((QMdiArea *)_o,*(TabShape *)brush);
          return;
        }
        break;
      case 7:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setTabPosition((QMdiArea *)_o,*(TabPosition *)brush);
          return;
        }
      }
      goto LAB_0040fe97;
    }
    break;
  case IndexOfMethod:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      QtMocHelpers::indexOfMethod<void(QMdiArea::*)(QMdiSubWindow*)>
                ((QtMocHelpers *)_a,(void **)subWindowActivated,0,0);
      return;
    }
    goto LAB_0040fe97;
  case RegisterMethodArgumentMetaType:
    if (_id == 8) {
      puVar4 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        *puVar4 = &QtPrivate::QMetaTypeInterfaceWrapper<QWidget_*>::metaType;
        break;
      }
    }
    else {
      puVar4 = (undefined8 *)*_a;
    }
    *puVar4 = 0;
  }
switchD_0040f9f7_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_0040fe97:
  __stack_chk_fail();
}

Assistant:

void QMdiArea::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QMdiArea *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->subWindowActivated((*reinterpret_cast< std::add_pointer_t<QMdiSubWindow*>>(_a[1]))); break;
        case 1: _t->setActiveSubWindow((*reinterpret_cast< std::add_pointer_t<QMdiSubWindow*>>(_a[1]))); break;
        case 2: _t->tileSubWindows(); break;
        case 3: _t->cascadeSubWindows(); break;
        case 4: _t->closeActiveSubWindow(); break;
        case 5: _t->closeAllSubWindows(); break;
        case 6: _t->activateNextSubWindow(); break;
        case 7: _t->activatePreviousSubWindow(); break;
        case 8: _t->setupViewport((*reinterpret_cast< std::add_pointer_t<QWidget*>>(_a[1]))); break;
        case 9: _t->d_func()->_q_deactivateAllWindows(); break;
        case 10: _t->d_func()->_q_processWindowStateChanged((*reinterpret_cast< std::add_pointer_t<Qt::WindowStates>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<Qt::WindowStates>>(_a[2]))); break;
        case 11: _t->d_func()->_q_currentTabChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 12: _t->d_func()->_q_closeTab((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 13: _t->d_func()->_q_moveTab((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 8:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QWidget* >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QMdiArea::*)(QMdiSubWindow * )>(_a, &QMdiArea::subWindowActivated, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QBrush*>(_v) = _t->background(); break;
        case 1: *reinterpret_cast<WindowOrder*>(_v) = _t->activationOrder(); break;
        case 2: *reinterpret_cast<ViewMode*>(_v) = _t->viewMode(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->documentMode(); break;
        case 4: *reinterpret_cast<bool*>(_v) = _t->tabsClosable(); break;
        case 5: *reinterpret_cast<bool*>(_v) = _t->tabsMovable(); break;
        case 6: *reinterpret_cast<QTabWidget::TabShape*>(_v) = _t->tabShape(); break;
        case 7: *reinterpret_cast<QTabWidget::TabPosition*>(_v) = _t->tabPosition(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setBackground(*reinterpret_cast<QBrush*>(_v)); break;
        case 1: _t->setActivationOrder(*reinterpret_cast<WindowOrder*>(_v)); break;
        case 2: _t->setViewMode(*reinterpret_cast<ViewMode*>(_v)); break;
        case 3: _t->setDocumentMode(*reinterpret_cast<bool*>(_v)); break;
        case 4: _t->setTabsClosable(*reinterpret_cast<bool*>(_v)); break;
        case 5: _t->setTabsMovable(*reinterpret_cast<bool*>(_v)); break;
        case 6: _t->setTabShape(*reinterpret_cast<QTabWidget::TabShape*>(_v)); break;
        case 7: _t->setTabPosition(*reinterpret_cast<QTabWidget::TabPosition*>(_v)); break;
        default: break;
        }
    }
}